

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall wasm::Literal::eqz(Literal *__return_storage_ptr__,Literal *this)

{
  BasicType BVar1;
  Literal local_88;
  Literal local_70;
  Literal local_58;
  Literal local_30;
  Literal *local_18;
  Literal *this_local;
  
  local_18 = this;
  this_local = __return_storage_ptr__;
  BVar1 = wasm::Type::getBasic(&this->type);
  switch(BVar1) {
  case none:
  case unreachable:
  case v128:
    handle_unreachable("unexpected type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                       ,0x3c6);
  case i32:
    Literal(&local_30,0);
    eq(__return_storage_ptr__,this,&local_30);
    ~Literal(&local_30);
    break;
  case i64:
    Literal(&local_58,0);
    eq(__return_storage_ptr__,this,&local_58);
    ~Literal(&local_58);
    break;
  case f32:
    Literal(&local_70,0.0);
    eq(__return_storage_ptr__,this,&local_70);
    ~Literal(&local_70);
    break;
  case f64:
    Literal(&local_88,0.0);
    eq(__return_storage_ptr__,this,&local_88);
    ~Literal(&local_88);
    break;
  default:
    handle_unreachable("invalid type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                       ,0x3c8);
  }
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::eqz() const {
  switch (type.getBasic()) {
    case Type::i32:
      return eq(Literal(int32_t(0)));
    case Type::i64:
      return eq(Literal(int64_t(0)));
    case Type::f32:
      return eq(Literal(float(0)));
    case Type::f64:
      return eq(Literal(double(0)));
    case Type::v128:
    case Type::none:
    case Type::unreachable:
      WASM_UNREACHABLE("unexpected type");
  }
  WASM_UNREACHABLE("invalid type");
}